

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

double __thiscall calc::OperatorNode::eval(OperatorNode *this)

{
  element_type *peVar1;
  logic_error *plVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double right;
  double left;
  OperatorNode *this_local;
  
  peVar1 = std::__shared_ptr_access<calc::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<calc::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->left_);
  (**peVar1->_vptr_Node)();
  peVar1 = std::__shared_ptr_access<calc::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<calc::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->right_);
  (**peVar1->_vptr_Node)();
  switch(this->type_) {
  case Plus:
    this_local = (OperatorNode *)(extraout_XMM0_Qa + extraout_XMM0_Qa_00);
    break;
  case Minus:
    this_local = (OperatorNode *)(extraout_XMM0_Qa - extraout_XMM0_Qa_00);
    break;
  case Prod:
    this_local = (OperatorNode *)(extraout_XMM0_Qa * extraout_XMM0_Qa_00);
    break;
  case Div:
    if ((extraout_XMM0_Qa_00 == 0.0) && (!NAN(extraout_XMM0_Qa_00))) {
      plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar2,"Zero division");
      __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    this_local = (OperatorNode *)(extraout_XMM0_Qa / extraout_XMM0_Qa_00);
    break;
  case LeftBracket:
    this_local = (OperatorNode *)0x0;
    break;
  case RightBracket:
    this_local = (OperatorNode *)0x0;
    break;
  default:
    plVar2 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar2,"Unknown operator");
    __cxa_throw(plVar2,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return (double)this_local;
}

Assistant:

double OperatorNode::eval() const
{
	const double left = left_->eval();
	const double right = right_->eval();
	switch (type_)
	{
	case calc::OperatorType::Plus:
		return left + right;
	case calc::OperatorType::Minus:
		return left - right;
	case calc::OperatorType::Prod:
		return left * right;
	case calc::OperatorType::Div:
		if (right == 0)
		{
			throw std::logic_error("Zero division");
		}
		return left / right;
	case calc::OperatorType::LeftBracket:
		return 0;
	case calc::OperatorType::RightBracket:
		return 0;
	default:
		throw std::logic_error("Unknown operator");
	}
}